

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

size_t __thiscall rcg::Buffer::getPayloadType(Buffer *this)

{
  unsigned_long uVar1;
  undefined8 *in_RDI;
  void *unaff_retaddr;
  void *in_stack_00000008;
  
  Stream::getHandle((Stream *)*in_RDI);
  uVar1 = anon_unknown_5::getBufferValue<unsigned_long>
                    ((shared_ptr<const_rcg::GenTLWrapper> *)this,in_stack_00000008,unaff_retaddr,
                     (BUFFER_INFO_CMD)((ulong)in_RDI >> 0x20));
  return uVar1;
}

Assistant:

size_t Buffer::getPayloadType() const
{
  return getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                GenTL::BUFFER_INFO_PAYLOADTYPE);
}